

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetJavaClassFullName
          (string *__return_storage_ptr__,ClassNameResolver *this,string *name_without_package,
          FileDescriptor *file,bool immutable,bool kotlin)

{
  FileDescriptor *s;
  bool bVar1;
  ulong uVar2;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 local_2b;
  byte local_2a;
  byte local_29;
  bool kotlin_local;
  FileDescriptor *pFStack_28;
  bool immutable_local;
  FileDescriptor *file_local;
  string *name_without_package_local;
  ClassNameResolver *this_local;
  string *result;
  
  local_2b = 0;
  local_2a = kotlin;
  local_29 = immutable;
  pFStack_28 = file;
  file_local = (FileDescriptor *)name_without_package;
  name_without_package_local = (string *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = MultipleJavaFiles(pFStack_28,(bool)(local_29 & 1));
  if (bVar1) {
    FileJavaPackage_abi_cxx11_
              (&local_60,(java *)pFStack_28,(FileDescriptor *)(ulong)(local_29 & 1),immutable);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
    }
  }
  else {
    GetClassName_abi_cxx11_(&local_80,this,pFStack_28,(bool)(local_29 & 1),(bool)(local_2a & 1));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'$');
    }
  }
  s = file_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,".",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"$",&local_e9);
  StringReplace(&local_a0,(string *)s,&local_c0,&local_e8,true);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetJavaClassFullName(
    const std::string& name_without_package, const FileDescriptor* file,
    bool immutable, bool kotlin) {
  std::string result;
  if (MultipleJavaFiles(file, immutable)) {
    result = FileJavaPackage(file, immutable);
    if (!result.empty()) result += '.';
  } else {
    result = GetClassName(file, immutable, kotlin);
    if (!result.empty()) result += '$';
  }
  result += StringReplace(name_without_package, ".", "$", true);
  return result;
}